

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resizable_buffer.hpp
# Opt level: O2

unsigned_long __thiscall duckdb::ByteBuffer::read<unsigned_long>(ByteBuffer *this)

{
  unsigned_long uVar1;
  
  available(this,8);
  uVar1 = *(unsigned_long *)this->ptr;
  this->len = this->len - 8;
  this->ptr = (data_ptr_t)((long)this->ptr + 8);
  return uVar1;
}

Assistant:

T read() {
		available(sizeof(T));
		return unsafe_read<T>();
	}